

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,RE *regex,char *file,int line,
          DeathTest **test)

{
  bool bVar1;
  int iVar2;
  UnitTestImpl *this_00;
  InternalRunDeathTestFlag *this_01;
  TestInfo *this_02;
  char *pcVar3;
  string *__lhs;
  ExecDeathTest *this_03;
  NoExecDeathTest *this_04;
  int __c;
  int __c_00;
  int __c_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  long in_FS_OFFSET;
  InternalRunDeathTestFlag *flag;
  UnitTestImpl *impl;
  DeathTest **test_local;
  int line_local;
  char *file_local;
  RE *regex_local;
  char *statement_local;
  DefaultDeathTestFactory *this_local;
  int local_118;
  int local_114;
  undefined1 local_110 [4];
  int death_test_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = statement;
  this_00 = GetUnitTestImpl();
  this_01 = UnitTestImpl::internal_run_death_test_flag(this_00);
  this_02 = UnitTestImpl::current_test_info(this_00);
  iVar2 = TestInfo::increment_death_test_count(this_02);
  local_114 = iVar2;
  if (this_01 != (InternalRunDeathTestFlag *)0x0) {
    pcVar3 = InternalRunDeathTestFlag::index(this_01,pcVar3,__c);
    if ((int)pcVar3 < iVar2) {
      StreamableToString<int>(&local_b0,&local_114);
      std::operator+(&local_90,"Death test count (",&local_b0);
      __lhs_00 = &local_90;
      std::operator+(&local_70,__lhs_00,") somehow exceeded expected maximum (");
      pcVar3 = InternalRunDeathTestFlag::index(this_01,(char *)__lhs_00,__c_00);
      local_118 = (int)pcVar3;
      StreamableToString<int>(&local_d0,&local_118);
      std::operator+(&local_50,&local_70,&local_d0);
      std::operator+(&local_30,&local_50,")");
      DeathTest::set_last_death_test_message(&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      this_local._7_1_ = false;
      goto LAB_001b0a62;
    }
    __lhs = InternalRunDeathTestFlag::file_abi_cxx11_(this_01);
    pcVar3 = file;
    bVar1 = std::operator==(__lhs,file);
    if (((!bVar1) || (iVar2 = InternalRunDeathTestFlag::line(this_01), iVar2 != line)) ||
       (pcVar3 = InternalRunDeathTestFlag::index(this_01,pcVar3,__c_01), (int)pcVar3 != local_114))
    {
      *test = (DeathTest *)0x0;
      this_local._7_1_ = true;
      goto LAB_001b0a62;
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          FLAGS_gtest_death_test_style_abi_cxx11_,"threadsafe");
  if (bVar1) {
    this_03 = (ExecDeathTest *)operator_new(0x40);
    ExecDeathTest::ExecDeathTest(this_03,statement,regex,file,line);
    *test = (DeathTest *)this_03;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            FLAGS_gtest_death_test_style_abi_cxx11_,"fast");
    if (!bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     "Unknown death test style \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_death_test_style_abi_cxx11_);
      std::operator+(&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     "\" encountered");
      DeathTest::set_last_death_test_message(&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)local_110);
      this_local._7_1_ = false;
      goto LAB_001b0a62;
    }
    this_04 = (NoExecDeathTest *)operator_new(0x30);
    NoExecDeathTest::NoExecDeathTest(this_04,statement,regex);
    *test = (DeathTest *)this_04;
  }
  this_local._7_1_ = true;
LAB_001b0a62:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return this_local._7_1_;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement, const RE* regex,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != NULL) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index)
          + ") somehow exceeded expected maximum ("
          + StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = NULL;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, regex, file, line);
  }

# elif GTEST_OS_FUCHSIA

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new FuchsiaDeathTest(statement, regex, file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, regex, file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, regex);
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(
        "Unknown death test style \"" + GTEST_FLAG(death_test_style)
        + "\" encountered");
    return false;
  }